

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ResolveExprListNames(NameContext *pNC,ExprList *pList)

{
  uint uVar1;
  Expr *pExpr;
  int iVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  ExprList_item *pEVar6;
  Walker w;
  Walker local_60;
  
  if (pList != (ExprList *)0x0) {
    local_60.pParse = pNC->pParse;
    local_60.xExprCallback = resolveExprStep;
    local_60.xSelectCallback = resolveSelectStep;
    local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    uVar5 = pNC->ncFlags & 0x8009010;
    pNC->ncFlags = pNC->ncFlags & 0xf7ff6fef;
    if (0 < pList->nExpr) {
      pEVar6 = pList->a;
      lVar4 = 0;
      local_60.u.pNC = pNC;
      do {
        pExpr = pEVar6->pExpr;
        if (pExpr == (Expr *)0x0) {
          bVar3 = false;
        }
        else {
          iVar2 = (local_60.pParse)->nHeight + pExpr->nHeight;
          (local_60.pParse)->nHeight = iVar2;
          if ((local_60.pParse)->db->aLimit[3] < iVar2) {
            sqlite3ErrorMsg(local_60.pParse,"Expression tree is too large (maximum depth %d)");
            bVar3 = true;
          }
          else {
            walkExpr(&local_60,pExpr);
            (local_60.pParse)->nHeight = (local_60.pParse)->nHeight - pExpr->nHeight;
            uVar1 = pNC->ncFlags;
            if ((uVar1 & 0x8009010) != 0) {
              pExpr->flags = pExpr->flags | uVar1 & 0x8010;
              uVar5 = uVar5 | uVar1 & 0x8009010;
              pNC->ncFlags = uVar1 & 0xf7ff6fef;
            }
            bVar3 = 0 < (local_60.pParse)->nErr;
          }
        }
        if (bVar3) {
          return 2;
        }
        lVar4 = lVar4 + 1;
        pEVar6 = pEVar6 + 1;
      } while (lVar4 < pList->nExpr);
    }
    pNC->ncFlags = pNC->ncFlags | uVar5;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprListNames(
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  ExprList *pList         /* The expression list to be analyzed. */
){
  int i;
  int savedHasAgg = 0;
  Walker w;
  if( pList==0 ) return WRC_Continue;
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.u.pNC = pNC;
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    if( pExpr==0 ) continue;
#if SQLITE_MAX_EXPR_DEPTH>0
    w.pParse->nHeight += pExpr->nHeight;
    if( sqlite3ExprCheckHeight(w.pParse, w.pParse->nHeight) ){
      return WRC_Abort;
    }
#endif
    sqlite3WalkExpr(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
    w.pParse->nHeight -= pExpr->nHeight;
#endif
    assert( EP_Agg==NC_HasAgg );
    assert( EP_Win==NC_HasWin );
    testcase( pNC->ncFlags & NC_HasAgg );
    testcase( pNC->ncFlags & NC_HasWin );
    if( pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg) ){
      ExprSetProperty(pExpr, pNC->ncFlags & (NC_HasAgg|NC_HasWin) );
      savedHasAgg |= pNC->ncFlags &
                          (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
      pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
    }
    if( w.pParse->nErr>0 ) return WRC_Abort;
  }
  pNC->ncFlags |= savedHasAgg;
  return WRC_Continue;
}